

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O3

string * __thiscall
bwtil::FileReader::toString_abi_cxx11_(string *__return_storage_ptr__,FileReader *this)

{
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  std::istream::seekg((long)this->fs,_S_beg);
  this->pos = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->n);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  std::istream::read((char *)this->fs,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
  std::istream::seekg((long)this->fs,_S_beg);
  this->pos = 0;
  return __return_storage_ptr__;
}

Assistant:

string toString(){

		rewind();
		string s;

		s = string(n,'e');//allocate space for n chars
		fs->read((char *)s.data(),n);

		/*while(not eof())
			s += get();*/

		rewind();

		return s;

	}